

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O1

string * helics::CoreFactory::MasterCoreBuilder::getIndexedBuilderName_abi_cxx11_(size_t index)

{
  element_type *peVar1;
  long lVar2;
  shared_ptr<helics::CoreFactory::MasterCoreBuilder> *psVar3;
  HelicsException *this;
  ulong uVar4;
  string_view message;
  
  psVar3 = instance();
  peVar1 = (psVar3->
           super___shared_ptr<helics::CoreFactory::MasterCoreBuilder,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  lVar2 = (long)(peVar1->builders).
                super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(peVar1->builders).
                 super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 3) * 0x6db6db6db6db6db7;
  if (index <= uVar4 && uVar4 - index != 0) {
    return (string *)(lVar2 + index * 0x38 + 0x10);
  }
  this = (HelicsException *)__cxa_allocate_exception(0x28);
  message._M_str = "core type index is not available";
  message._M_len = 0x20;
  HelicsException::HelicsException(this,message);
  __cxa_throw(this,&HelicsException::typeinfo,HelicsException::~HelicsException);
}

Assistant:

static const std::string& getIndexedBuilderName(std::size_t index)
    {
        const auto& blder = instance();
        if (blder->builders.size() <= index) {
            throw(HelicsException("core type index is not available"));
        }
        return std::get<1>(blder->builders[index]);
    }